

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ref.c
# Opt level: O2

void do_close(uv_tcp_t *handle)

{
  int iVar1;
  char *pcVar2;
  undefined8 uStack_10;
  
  if (shutdown_before_close == '\x01') {
    iVar1 = uv_shutdown(&shutdown_req,handle,shutdown_cb);
    if (iVar1 == 0) {
      iVar1 = uv_tcp_close_reset(handle,close_cb);
      if (iVar1 == -0x16) {
LAB_001559e8:
        uv_close(&tcp_server,0);
        return;
      }
      pcVar2 = "UV_EINVAL == uv_tcp_close_reset(handle, close_cb)";
      uStack_10 = 0x43;
    }
    else {
      pcVar2 = "0 == uv_shutdown(&shutdown_req, (uv_stream_t*) handle, shutdown_cb)";
      uStack_10 = 0x42;
    }
  }
  else {
    iVar1 = uv_tcp_close_reset(handle,close_cb);
    if (iVar1 == 0) {
      iVar1 = uv_shutdown(&shutdown_req,handle,shutdown_cb);
      if (iVar1 == -0x6b) goto LAB_001559e8;
      pcVar2 = "UV_ENOTCONN == uv_shutdown(&shutdown_req, (uv_stream_t*) handle, shutdown_cb)";
      uStack_10 = 0x46;
    }
    else {
      pcVar2 = "0 == uv_tcp_close_reset(handle, close_cb)";
      uStack_10 = 0x45;
    }
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-close-reset.c"
          ,uStack_10,pcVar2);
  abort();
}

Assistant:

static void do_close(void* handle) {
  close_cb_called = 0;
  uv_close((uv_handle_t*)handle, close_cb);
  ASSERT(close_cb_called == 0);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(close_cb_called == 1);
}